

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsChaseCamera.cpp
# Opt level: O1

void __thiscall chrono::utils::ChChaseCamera::Raise(ChChaseCamera *this,int val)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if ((val != 0) && (this->m_state == Free)) {
    dVar1 = (this->m_up).m_data[0] * 0.01;
    dVar2 = (this->m_up).m_data[1] * 0.01;
    dVar3 = (this->m_up).m_data[2] * 0.01;
    dVar4 = (this->m_loc).m_data[0];
    if (val < 0) {
      (this->m_loc).m_data[0] = dVar1 + dVar4;
      (this->m_loc).m_data[1] = dVar2 + (this->m_loc).m_data[1];
      dVar4 = dVar3 + (this->m_loc).m_data[2];
    }
    else {
      (this->m_loc).m_data[0] = dVar4 - dVar1;
      dVar4 = (this->m_loc).m_data[2];
      (this->m_loc).m_data[1] = (this->m_loc).m_data[1] - dVar2;
      dVar4 = dVar4 - dVar3;
    }
    (this->m_loc).m_data[2] = dVar4;
  }
  return;
}

Assistant:

void ChChaseCamera::Raise(int val) {
    if (val == 0 || m_state != Free)
        return;

    if (val < 0)
        m_loc += 0.01 * m_up;
    else
        m_loc -= 0.01 * m_up;
}